

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_dictionary.cpp
# Opt level: O3

PreparedDictionary *
duckdb_brotli::CreatePreparedDictionary(MemoryManager *m,uint8_t *source,size_t source_size)

{
  long lVar1;
  void *__s;
  long lVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  void *p;
  ulong uVar7;
  PreparedDictionary *pPVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  size_t n;
  ulong uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  ulong uVar20;
  undefined4 uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  
  if (source_size < 0x200001) {
    uVar14 = 0x11;
    uVar22 = 7;
  }
  else {
    uVar6 = 0x200000;
    uVar14 = 0x11;
    do {
      uVar22 = uVar14;
      uVar14 = uVar22 + 1;
      uVar6 = uVar6 * 2;
      if (source_size <= uVar6) break;
    } while (uVar22 < 0x15);
    uVar22 = uVar22 - 9;
  }
  bVar9 = (byte)uVar22;
  uVar12 = 1 << (bVar9 & 0x1f);
  bVar10 = (byte)uVar14;
  uVar23 = 1 << (bVar10 & 0x1f);
  lVar25 = 2L << (bVar10 & 0x3f);
  if (uVar14 - uVar22 < 0x10 && (uVar22 <= uVar14 && uVar22 < 0x11)) {
    n = (4L << (bVar10 & 0x3f)) + lVar25 + (8L << (bVar9 & 0x3f)) + source_size * 4;
    if (n == 0) {
      p = (void *)0x0;
    }
    else {
      p = BrotliAllocate(m,n);
    }
    uVar13 = (ulong)uVar12;
    __s = (void *)((long)p + uVar13 * 8);
    uVar24 = (ulong)uVar23;
    uVar6 = (ulong)(uVar23 * 2);
    lVar4 = uVar24 * 4 + uVar6;
    uVar23 = 0;
    memset(__s,0,uVar6);
    if (7 < source_size) {
      uVar7 = 8;
      do {
        uVar17 = (int)uVar7 - 8;
        uVar15 = (*(ulong *)(source + uVar17) & 0xffffffffff) * 0x1fe35a7bd3579bd3 >>
                 (0x40 - bVar10 & 0x3f) & 0xffffffff;
        sVar3 = *(short *)((long)__s + uVar15 * 2);
        if (sVar3 == 0) {
          uVar21 = 0xffffffff;
        }
        else {
          uVar21 = *(undefined4 *)((long)__s + uVar15 * 4 + uVar6);
        }
        *(undefined4 *)((long)__s + (ulong)uVar17 * 4 + lVar4) = uVar21;
        *(uint *)((long)__s + uVar15 * 4 + uVar6) = uVar17;
        uVar19 = sVar3 + 1;
        if (0x1f < uVar19) {
          uVar19 = 0x20;
        }
        *(ushort *)((long)__s + uVar15 * 2) = uVar19;
        bVar26 = uVar7 < source_size;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar26);
    }
    uVar7 = 0;
    do {
      if (uVar7 < uVar24) {
        uVar17 = 0x20;
        do {
          uVar11 = 0;
          uVar15 = uVar7;
          while (uVar11 < 0xffff) {
            uVar18 = (uint)*(ushort *)((long)__s + uVar15 * 2);
            if (uVar17 < uVar18) {
              uVar18 = uVar17;
            }
            uVar11 = uVar11 + uVar18;
            uVar15 = uVar15 + uVar13;
            if (uVar24 <= uVar15) goto LAB_002eaa93;
          }
          uVar17 = uVar17 - 1;
        } while( true );
      }
      uVar11 = 0;
      uVar17 = 0x20;
LAB_002eaa93:
      *(uint *)((long)p + uVar7 * 4 + uVar13 * 4) = uVar17;
      *(uint *)((long)p + uVar7 * 4) = uVar11;
      uVar23 = uVar23 + uVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar13);
    pPVar8 = (PreparedDictionary *)
             BrotliAllocate(m,(4L << (bVar9 & 0x3f)) + lVar25 + (ulong)uVar23 * 4 + 0x20);
    lVar25 = uVar13 * 4;
    pPVar8->magic = 0xdebcede3;
    pPVar8->num_items = uVar23;
    pPVar8->source_size = (uint32_t)source_size;
    pPVar8->hash_bits = 0x28;
    pPVar8->bucket_bits = uVar14;
    pPVar8->slot_bits = uVar22;
    *(uint8_t **)((long)&pPVar8[1].magic + (ulong)uVar23 * 4 + uVar24 * 2 + lVar25) = source;
    uVar7 = 0;
    uVar16 = 0;
    do {
      (&pPVar8[1].magic)[uVar7] = uVar16;
      uVar16 = uVar16 + *(int *)((long)p + uVar7 * 4);
      *(undefined4 *)((long)p + uVar7 * 4) = 0;
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
    lVar2 = uVar24 * 2 + uVar13 * 4;
    uVar7 = 0;
    do {
      uVar15 = (ulong)(uVar12 - 1 & (uint)uVar7);
      uVar22 = *(uint *)((long)p + uVar15 * 4 + uVar13 * 4);
      uVar14 = (uint)*(ushort *)((long)__s + uVar7 * 2);
      if (uVar22 < uVar14) {
        uVar14 = uVar22;
      }
      if (uVar14 == 0) {
        *(undefined2 *)((long)&pPVar8[1].magic + uVar7 * 2 + lVar25) = 0xffff;
      }
      else {
        uVar22 = *(uint *)((long)p + uVar15 * 4);
        *(short *)((long)&pPVar8[1].magic + uVar7 * 2 + lVar25) = (short)uVar22;
        uVar23 = (&pPVar8[1].magic)[uVar15];
        *(uint *)((long)p + uVar15 * 4) = uVar22 + uVar14;
        lVar5 = uVar7 * 4 + uVar6;
        lVar1 = ((ulong)uVar23 + (ulong)uVar22) * 4;
        uVar15 = 0;
        do {
          uVar20 = uVar15;
          uVar22 = *(uint *)((long)__s + lVar5);
          *(uint *)((long)&pPVar8[1].magic + uVar20 * 4 + lVar1 + lVar2) = uVar22;
          lVar5 = (ulong)uVar22 * 4 + lVar4;
          uVar15 = uVar20 + 1;
        } while ((ulong)uVar14 != uVar20 + 1);
        *(uint *)((long)&pPVar8[1].magic + uVar20 * 4 + lVar1 + lVar2) = uVar22 | 0x80000000;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar24);
    BrotliFree(m,p);
  }
  else {
    pPVar8 = (PreparedDictionary *)0x0;
  }
  return pPVar8;
}

Assistant:

PreparedDictionary* duckdb_brotli::CreatePreparedDictionary(MemoryManager* m,
    const uint8_t* source, size_t source_size) {
  uint32_t bucket_bits = 17;
  uint32_t slot_bits = 7;
  uint32_t hash_bits = 40;
  uint16_t bucket_limit = 32;
  size_t volume = 16u << bucket_bits;
  /* Tune parameters to fit dictionary size. */
  while (volume < source_size && bucket_bits < 22) {
    bucket_bits++;
    slot_bits++;
    volume <<= 1;
  }
  return CreatePreparedDictionaryWithParams(m,
      source, source_size, bucket_bits, slot_bits, hash_bits, bucket_limit);
}